

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

bool __thiscall cfd::Psbt::HasAllUtxos(Psbt *this)

{
  long lVar1;
  CfdException *pCVar2;
  long *plVar3;
  long lVar4;
  undefined1 local_40 [32];
  
  lVar4 = *(long *)&this->field_0x8;
  if (lVar4 == 0) {
    local_40._0_8_ = "cfd_psbt.cpp";
    local_40._8_4_ = 0xef;
    local_40._16_8_ = "HasAllUtxos";
    core::logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_40._0_8_ = local_40 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"psbt pointer is null.","");
    core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_40);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (*(long *)(lVar4 + 8) != 0) {
    lVar1 = *(long *)(lVar4 + 0x18);
    if (lVar1 != 0) {
      plVar3 = (long *)(*(long *)(lVar4 + 0x10) + 8);
      lVar4 = lVar1;
      do {
        if ((*plVar3 == 0) && (plVar3[-1] == 0)) {
          return false;
        }
        plVar3 = plVar3 + 0x22;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    return lVar1 != 0;
  }
  local_40._0_8_ = "cfd_psbt.cpp";
  local_40._8_4_ = 0xf3;
  local_40._16_8_ = "HasAllUtxos";
  core::logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"psbt base tx is null");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"psbt base tx is null.","");
  core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

bool Psbt::HasAllUtxos() const {
  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "psbt base tx is null.");
  }

  for (size_t index = 0; index < psbt_pointer->num_inputs; ++index) {
    if ((psbt_pointer->inputs[index].witness_utxo == nullptr) &&
        (psbt_pointer->inputs[index].utxo == nullptr)) {
      return false;
    }
  }
  return (psbt_pointer->num_inputs != 0);
}